

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O1

GMM_STATUS __thiscall
GmmLib::GmmTextureCalc::GetTexStdLayoutOffset
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_REQ_OFFSET_INFO *pReqInfo)

{
  GMM_TILE_MODE GVar1;
  GMM_GFX_SIZE_T GVar2;
  anon_struct_8_44_94931171_for_Info aVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  GMM_PLATFORM_INFO *pGVar9;
  undefined4 extraout_var;
  ulong uVar10;
  uint32_t *puVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  uint32_t local_7c;
  uint32_t local_78;
  anon_struct_12_3_eb34d150 Element;
  GMM_GFX_SIZE_T local_60;
  uint local_38;
  
  GVar2 = (pReqInfo->StdLayout).Offset;
  puVar11 = &pReqInfo->ArrayIndex;
  if (GVar2 == 0xffffffffffffffff) {
    puVar11 = &pTexInfo->ArraySize;
  }
  uVar15 = ((uint)(pTexInfo->Type == RESOURCE_CUBE) * 5 + 1) * *puVar11;
  aVar3 = (pTexInfo->Flags).Info;
  iVar4 = 0x10000;
  if (((ulong)aVar3 & 0x104000000000) == 0) {
    iVar4 = (uint)(((ulong)aVar3 & 0x81000000000) != 0) << 0xc;
  }
  pGVar9 = GmmGetPlatformInfo(this->pGmmLibContext);
  uVar5 = pTexInfo->BitsPerPixel;
  GVar1 = pTexInfo->TileMode;
  GetCompressionBlockDimensions(this,pTexInfo->Format,&local_7c,&local_78,&Element.Width);
  uVar5 = (pGVar9->TileInfo[GVar1].LogicalTileWidth / (uVar5 >> 3)) * local_7c;
  uVar13 = local_78 * pGVar9->TileInfo[GVar1].LogicalTileHeight;
  uVar14 = Element.Width * pGVar9->TileInfo[GVar1].LogicalTileDepth;
  if (uVar15 == 0) {
    local_38 = pReqInfo->MipLevel;
  }
  else {
    local_38 = (pTexInfo->Alignment).MipTailStartLod;
    if (pTexInfo->MaxLod < local_38) {
      local_38 = pTexInfo->MaxLod;
    }
  }
  (pReqInfo->StdLayout).Offset = 0;
  local_60 = 0;
  lVar18 = 0;
  lVar17 = 0;
  uVar12 = 0;
  Element._4_8_ = (ulong)uVar5;
  do {
    uVar16 = (uint)uVar12;
    iVar6 = (*this->_vptr_GmmTextureCalc[0x18])(this,pTexInfo,uVar12);
    uVar10 = CONCAT44(extraout_var,iVar6);
    uVar7 = (*this->_vptr_GmmTextureCalc[0x19])(this,pTexInfo,uVar12);
    uVar8 = (*this->_vptr_GmmTextureCalc[0x1a])(this,pTexInfo,uVar12);
    uVar12 = (ulong)uVar8;
    if (Element.Height != 0) {
      uVar10 = (uVar10 + (uVar5 - 1)) / (ulong)uVar5;
    }
    if (uVar13 != 0) {
      uVar7 = (uVar7 + (uVar13 - 1)) / uVar13;
    }
    if (uVar14 != 0) {
      uVar12 = (ulong)(uVar8 + (uVar14 - 1)) / (ulong)uVar14;
    }
    if (uVar16 <= (pTexInfo->Alignment).MipTailStartLod) {
      (pReqInfo->StdLayout).Offset = (pReqInfo->StdLayout).Offset + lVar18;
    }
    uVar8 = (int)uVar10 * iVar4;
    uVar10 = (ulong)(uVar7 * uVar8);
    if (uVar16 == pReqInfo->MipLevel) {
      local_60 = (pReqInfo->StdLayout).Offset;
      (pReqInfo->StdLayout).TileRowPitch = (ulong)uVar8;
      (pReqInfo->StdLayout).TileDepthPitch = uVar10;
    }
    lVar18 = uVar12 * uVar10;
    lVar17 = lVar17 + uVar10;
    uVar12 = (ulong)(uVar16 + 1);
  } while (uVar16 + 1 <= local_38);
  uVar5 = pReqInfo->Slice;
  if ((GVar2 == 0xffffffffffffffff) || (pReqInfo->MipLevel < (pTexInfo->Alignment).MipTailStartLod))
  {
    lVar18 = (lVar18 + (pReqInfo->StdLayout).Offset) * (ulong)uVar15 + local_60;
  }
  else {
    GVar2 = (pReqInfo->StdLayout).Offset;
    uVar13 = (*this->_vptr_GmmTextureCalc[9])();
    lVar18 = (ulong)uVar13 + (lVar18 + GVar2) * (ulong)uVar15 + (pReqInfo->StdLayout).Offset;
  }
  lVar17 = lVar17 * (ulong)uVar5;
  if ((ulong)uVar5 == 0) {
    lVar17 = 0;
  }
  (pReqInfo->StdLayout).Offset = lVar17 + lVar18;
  return GMM_SUCCESS;
}

Assistant:

GMM_STATUS GmmLib::GmmTextureCalc::GetTexStdLayoutOffset(GMM_TEXTURE_INFO *   pTexInfo,
                                                         GMM_REQ_OFFSET_INFO *pReqInfo)
{
    uint32_t ReqArrayIndex;
    bool     NeedSurfaceSize = false;

    __GMM_ASSERT(pTexInfo);
    __GMM_ASSERT(GMM_IS_64KB_TILE(pTexInfo->Flags) || pTexInfo->Flags.Info.TiledYf);
    __GMM_ASSERT(
    (pTexInfo->Type == RESOURCE_2D) ||
    (pTexInfo->Type == RESOURCE_3D) ||
    (pTexInfo->Type == RESOURCE_CUBE));
    __GMM_ASSERT(GmmIsPlanar(pTexInfo->Format) == false); // Planar not support

    if(pReqInfo->StdLayout.Offset == -1) // Special Req for Surface Size
    {
        NeedSurfaceSize = true;
        ReqArrayIndex   = // TODO(Medium): Add planar support.
        (pTexInfo->ArraySize * ((pTexInfo->Type == RESOURCE_CUBE) ? 6 : 1));
    }
    else
    {
        ReqArrayIndex =
        (pReqInfo->ArrayIndex * ((pTexInfo->Type == RESOURCE_CUBE) ? 6 : 1));
    }

    {
        uint32_t TileSize = 0;

        // TileYs (64) and TileYf (4)
        if(GMM_IS_64KB_TILE(pTexInfo->Flags))
        {
            TileSize = GMM_KBYTE(64);
        }
        else if(GMM_IS_4KB_TILE(pTexInfo->Flags))
        {
            TileSize = GMM_KBYTE(4);
        }

        const GMM_PLATFORM_INFO *pPlatform       = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);
        uint32_t                 BytesPerElement = pTexInfo->BitsPerPixel / CHAR_BIT;
        GMM_TILE_MODE            TileMode        = pTexInfo->TileMode;
        struct
        {
            uint32_t Width, Height, Depth;
        } Element, Tile;

        __GMM_ASSERT(TileMode < GMM_TILE_MODES);

        GetCompressionBlockDimensions(
        pTexInfo->Format,
        &Element.Width,
        &Element.Height,
        &Element.Depth);

        Tile.Width =
        (pPlatform->TileInfo[TileMode].LogicalTileWidth / BytesPerElement) *
        Element.Width;

        Tile.Height =
        pPlatform->TileInfo[TileMode].LogicalTileHeight *
        Element.Height;

        Tile.Depth =
        pPlatform->TileInfo[TileMode].LogicalTileDepth *
        Element.Depth;

        {
            GMM_GFX_ADDRESS TargetLodOffset = 0;
            GMM_GFX_SIZE_T  PrevMipSize     = 0;
            GMM_GFX_SIZE_T  SliceOffset     = 0;
            GMM_GFX_SIZE_T  SlicePitch      = 0;
            uint32_t        Lod;
            uint32_t        EffectiveMaxLod =
            (ReqArrayIndex == 0) ?
            pReqInfo->MipLevel :
            GFX_MIN(pTexInfo->MaxLod, pTexInfo->Alignment.MipTailStartLod);

            pReqInfo->StdLayout.Offset = 0;
            for(Lod = 0; Lod <= EffectiveMaxLod; Lod++)
            {
                GMM_GFX_SIZE_T MipWidth  = GmmTexGetMipWidth(pTexInfo, Lod);
                uint32_t       MipHeight = GmmTexGetMipHeight(pTexInfo, Lod);
                uint32_t       MipDepth  = GmmTexGetMipDepth(pTexInfo, Lod);

                uint32_t MipCols = GFX_ULONG_CAST(
                GFX_CEIL_DIV(
                MipWidth,
                Tile.Width));
                uint32_t MipRows =
                GFX_CEIL_DIV(
                MipHeight,
                Tile.Height);
                uint32_t MipDepthTiles =
                GFX_CEIL_DIV(
                MipDepth,
                Tile.Depth);
                uint32_t RowPitch   = MipCols * TileSize; // Bytes from one tile row to the next.
                uint32_t DepthPitch = RowPitch * MipRows; // Bytes from one depth slice of tiles to the next.

                if(Lod <= pTexInfo->Alignment.MipTailStartLod)
                {
                    pReqInfo->StdLayout.Offset += PrevMipSize;
                }

                if(Lod == pReqInfo->MipLevel)
                {
                    TargetLodOffset = pReqInfo->StdLayout.Offset;

                    pReqInfo->StdLayout.TileRowPitch   = RowPitch;
                    pReqInfo->StdLayout.TileDepthPitch = DepthPitch;
                }

                PrevMipSize = (GMM_GFX_SIZE_T)DepthPitch * MipDepthTiles;
                SlicePitch += DepthPitch;
            }

            if(pReqInfo->Slice > 0)
            {
                SliceOffset = SlicePitch * pReqInfo->Slice;
            }

            if(!NeedSurfaceSize && pReqInfo->MipLevel >= pTexInfo->Alignment.MipTailStartLod)
            {
                pReqInfo->StdLayout.Offset += (ReqArrayIndex * (pReqInfo->StdLayout.Offset + PrevMipSize)) +
                                              GetMipTailByteOffset(pTexInfo, pReqInfo->MipLevel);
            }
            else
            {
                pReqInfo->StdLayout.Offset = ReqArrayIndex * (pReqInfo->StdLayout.Offset + PrevMipSize) +
                                             TargetLodOffset;
            }

            pReqInfo->StdLayout.Offset += SliceOffset;
        }
    }

    return GMM_SUCCESS;
}